

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
          (cmGeneratorTarget *this,string *p,string *config)

{
  TargetType TVar1;
  CompatibleInterfacesBase *this_00;
  size_type sVar2;
  bool bVar3;
  
  TVar1 = this->Target->TargetTypeValue;
  bVar3 = false;
  if ((TVar1 != OBJECT_LIBRARY) && (bVar3 = false, TVar1 != INTERFACE_LIBRARY)) {
    this_00 = GetCompatibleInterfaces(this,config);
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this_00->PropsBool,p);
    bVar3 = sVar2 != 0;
  }
  return bVar3;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}